

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O2

int nifti_type_and_names_match(nifti_image *nim,int show_warn)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  size_t maxlen;
  size_t extraout_RDX;
  size_t sVar7;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  char func [27];
  
  pcVar5 = func;
  builtin_strncpy(func + 0x10,"ames_match",0xb);
  builtin_strncpy(func,"nifti_type_and_n",0x10);
  if (nim == (nifti_image *)0x0) {
    iVar4 = -1;
    if (show_warn == 0) {
      return -1;
    }
    pcVar6 = "** %s: missing nifti_image\n";
LAB_00109b6a:
    fprintf(_stderr,pcVar6,pcVar5);
  }
  else {
    bVar2 = false;
    bVar3 = true;
    if (nim->fname == (char *)0x0) {
      bVar2 = bVar3;
      if (show_warn != 0) {
        fprintf(_stderr,"** %s: missing header filename\n",func);
        bVar2 = true;
        goto LAB_00109b36;
      }
    }
    else {
LAB_00109b36:
      if ((nim->iname == (char *)0x0) && (bVar2 = bVar3, show_warn != 0)) {
        fprintf(_stderr,"** %s: missing image filename\n",func);
      }
    }
    if (3 < (uint)nim->nifti_type) {
      if (show_warn == 0) {
        return -1;
      }
      fprintf(_stderr,"** %s: bad nifti_type %d\n",func);
      return -1;
    }
    if (bVar2) {
      return -1;
    }
    pcVar5 = nifti_find_file_extension(nim->fname);
    pcVar6 = nifti_find_file_extension(nim->iname);
    if (pcVar5 == (char *)0x0) {
      if (show_warn != 0) {
        fprintf(_stderr,"-d missing NIFTI extension in header filename, %s\n",nim->fname);
        if (pcVar6 != (char *)0x0) {
          return 0;
        }
        goto LAB_00109d8d;
      }
    }
    else {
      if (pcVar6 != (char *)0x0) {
        uVar1 = nim->nifti_type;
        if ((uVar1 == 0) || (uVar1 == 2)) {
          iVar4 = fileext_n_compare(pcVar5,".hdr",maxlen);
          sVar7 = extraout_RDX_00;
          if ((show_warn != 0) && (iVar4 != 0)) {
            fprintf(_stderr,"-d no \'.hdr\' extension, but NIFTI type is %d, %s\n",(ulong)uVar1,
                    nim->fname);
            sVar7 = extraout_RDX_01;
          }
          iVar4 = fileext_n_compare(pcVar6,".img",sVar7);
          if (show_warn == 0) {
            return 1;
          }
          if (iVar4 == 0) {
            return 1;
          }
          fprintf(_stderr,"-d no \'.img\' extension, but NIFTI type is %d, %s\n",
                  (ulong)(uint)nim->nifti_type,nim->iname);
          return 1;
        }
        if (uVar1 != 1) {
          return 1;
        }
        iVar4 = fileext_n_compare(pcVar5,".nii",maxlen);
        sVar7 = extraout_RDX;
        if ((show_warn != 0) && (iVar4 != 0)) {
          fprintf(_stderr,"-d NIFTI_FTYPE 1, but no .nii extension in header filename, %s\n",
                  nim->fname);
          sVar7 = extraout_RDX_02;
        }
        iVar4 = fileext_n_compare(pcVar6,".nii",sVar7);
        if ((show_warn != 0) && (iVar4 != 0)) {
          fprintf(_stderr,"-d NIFTI_FTYPE 1, but no .nii extension in image filename, %s\n",
                  nim->iname);
        }
        pcVar5 = nim->fname;
        pcVar6 = nim->iname;
        iVar4 = strcmp(pcVar5,pcVar6);
        if (show_warn == 0) {
          return 1;
        }
        if (iVar4 == 0) {
          return 1;
        }
        fprintf(_stderr,"-d NIFTI_FTYPE 1, but header and image filenames differ: %s, %s\n",pcVar5,
                pcVar6);
        return 1;
      }
      if (show_warn != 0) {
LAB_00109d8d:
        pcVar5 = nim->iname;
        pcVar6 = "-d missing NIFTI extension in image filename, %s\n";
        iVar4 = 0;
        goto LAB_00109b6a;
      }
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int nifti_type_and_names_match( nifti_image * nim, int show_warn )
{
   char func[] = "nifti_type_and_names_match";
   const char * ext_h;  /* header  filename extension */
   const char * ext_i;  /* image filename extension */
   int  errs = 0;          /* error counter */

   /* sanity checks */
   if( !nim ){
      if( show_warn ) fprintf(stderr,"** %s: missing nifti_image\n", func);
      return -1;
   }
   if( !nim->fname ){
      if( show_warn ) fprintf(stderr,"** %s: missing header filename\n", func);
      errs++;
   }
   if( !nim->iname ){
      if( show_warn ) fprintf(stderr,"** %s: missing image filename\n", func);
      errs++;
   }
   if( !is_valid_nifti_type(nim->nifti_type) ){
      if( show_warn )
         fprintf(stderr,"** %s: bad nifti_type %d\n", func, nim->nifti_type);
      errs++;
   }

   if( errs ) return -1;   /* then do not proceed */

   /* get pointers to extensions */
   ext_h = nifti_find_file_extension( nim->fname );
   ext_i = nifti_find_file_extension( nim->iname );

   /* check for filename extensions */
   if( !ext_h ){
      if( show_warn )
         fprintf(stderr,"-d missing NIFTI extension in header filename, %s\n",
                 nim->fname);
      errs++;
   }
   if( !ext_i ){
      if( show_warn )
         fprintf(stderr,"-d missing NIFTI extension in image filename, %s\n",
                 nim->iname);
      errs++;
   }

   if( errs ) return 0;   /* do not proceed, but this is just a mis-match */

   /* general tests */
   if( nim->nifti_type == NIFTI_FTYPE_NIFTI1_1 ){  /* .nii */
      if( fileext_n_compare(ext_h,".nii",4) ) {
         if( show_warn )
            fprintf(stderr,
            "-d NIFTI_FTYPE 1, but no .nii extension in header filename, %s\n",
            nim->fname);
         errs++;
      }
      if( fileext_n_compare(ext_i,".nii",4) ) {
         if( show_warn )
            fprintf(stderr,
            "-d NIFTI_FTYPE 1, but no .nii extension in image filename, %s\n",
            nim->iname);
         errs++;
      }
      if( strcmp(nim->fname, nim->iname) != 0 ){
         if( show_warn )
            fprintf(stderr,
            "-d NIFTI_FTYPE 1, but header and image filenames differ: %s, %s\n",
            nim->fname, nim->iname);
         errs++;
      }
   }
   else if( (nim->nifti_type == NIFTI_FTYPE_NIFTI1_2) || /* .hdr/.img */
            (nim->nifti_type == NIFTI_FTYPE_ANALYZE) )
   {
      if( fileext_n_compare(ext_h,".hdr",4) != 0 ){
         if( show_warn )
            fprintf(stderr,"-d no '.hdr' extension, but NIFTI type is %d, %s\n",
                    nim->nifti_type, nim->fname);
         errs++;
      }
      if( fileext_n_compare(ext_i,".img",4) != 0 ){
         if( show_warn )
            fprintf(stderr,"-d no '.img' extension, but NIFTI type is %d, %s\n",
                    nim->nifti_type, nim->iname);
         errs++;
      }
   }
   /* ignore any other nifti_type */

   return 1;
}